

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test::
~SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test
          (SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test
            ((SemanticAnalyserTest_UndeclaredVariableAccessInArgumentThrows_Test *)0x1e8dd8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, UndeclaredVariableAccessInArgumentThrows)
{
  std::string source = R"SRC(
  fn test(x: f32, y: f32): void
  {
    print("x = " : x : " y = " : y);
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    test(x, y);
    ret 0;
  }
  )SRC";
  throwTest(source);
}